

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildElementUnsigned1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot baseRegSlot,uint32 index,
          RegSlot regSlot)

{
  undefined1 *puVar1;
  Instr **ppIVar2;
  undefined2 valueType;
  Opnd *this_00;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  ValueType VVar6;
  Instr *pIVar7;
  RegOpnd *baseOpnd;
  undefined4 *puVar8;
  IndirOpnd *pIVar9;
  RegOpnd *pRVar10;
  JitProfilingInstr *instr;
  anon_union_2_4_ea848c7b_for_ValueType_13 *this_01;
  Instr *pIVar11;
  undefined6 in_register_00000032;
  RegOpnd **ppRVar12;
  OpCode opcode;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  RegSlot local_40;
  uint32 local_3c;
  uint32 local_38;
  char local_31;
  
  local_40 = regSlot;
  local_3c = index;
  local_31 = Func::DoSimpleJitDynamicProfile(this->m_func);
  switch((int)CONCAT62(in_register_00000032,newOpcode)) {
  case 0x9e:
    local_38 = offset;
    baseOpnd = BuildSrcOpnd(this,baseRegSlot,TyVar);
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_4a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_48.field_0,false);
    VVar6 = ValueType::SetArrayTypeId((ValueType *)&local_4a.field_0,TypeIds_Array);
    IR::Opnd::SetValueType(&baseOpnd->super_Opnd,VVar6);
    puVar1 = &(baseOpnd->super_Opnd).field_0xb;
    *puVar1 = *puVar1 | 1;
    opcode = StElemI_A;
    if (local_31 != '\0') {
      opcode = StElemC;
    }
    break;
  case 0x9f:
    baseOpnd = IR::RegOpnd::New(TyVar,this->m_func);
    pRVar10 = BuildSrcOpnd(this,baseRegSlot,TyVar);
    local_44.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_46.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_44.field_0,false);
    VVar6 = ValueType::SetArrayTypeId((ValueType *)&local_46.field_0,TypeIds_Array);
    IR::Opnd::SetValueType(&pRVar10->super_Opnd,VVar6);
    puVar1 = &(pRVar10->super_Opnd).field_0xb;
    *puVar1 = *puVar1 | 1;
    pIVar7 = IR::Instr::New(LdArrHead,&baseOpnd->super_Opnd,&pRVar10->super_Opnd,this->m_func);
    AddInstr(this,pIVar7,offset);
    local_38 = 0xffffffff;
    goto LAB_004dabce;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1731,"(false)","Unknown ElementUnsigned1 opcode");
    if (bVar4) {
      *puVar8 = 0;
      return;
    }
LAB_004daee4:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  case 0xa1:
    baseOpnd = BuildSrcOpnd(this,baseRegSlot,TyVar);
    pIVar7 = (baseOpnd->m_sym->field_5).m_instrDef;
    if (pIVar7 == (Instr *)0x0) {
      pRVar10 = (RegOpnd *)0x0;
    }
    else {
      pRVar10 = (RegOpnd *)pIVar7->m_dst;
    }
    local_38 = offset;
    if (pRVar10 == (RegOpnd *)0x0) {
      pIVar7 = this->m_func->m_exitInstr->m_prev;
      if (pIVar7 != (Instr *)0x0) {
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        pIVar11 = (Instr *)0x0;
        do {
          if ((pIVar11 != (Instr *)0x0) && (pIVar11->m_prev != pIVar7)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x1715,
                               "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == tmpInstr)"
                               ,"Modifying instr list but not using EDITING iterator!");
            if (!bVar4) goto LAB_004daee4;
            *puVar8 = 0;
          }
          if (pIVar7->m_dst != (Opnd *)0x0) {
            ppRVar12 = (RegOpnd **)&pIVar7->m_dst;
            bVar4 = IR::Opnd::IsEqual(pIVar7->m_dst,&baseOpnd->super_Opnd);
            if (bVar4) {
LAB_004dad86:
              pRVar10 = *ppRVar12;
              goto LAB_004dad8a;
            }
            if (pIVar7->m_opcode == StElemC) {
              this_00 = &(*ppRVar12)->super_Opnd;
              OVar5 = IR::Opnd::GetKind(this_00);
              if (OVar5 != OpndKindIndir) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
                if (!bVar4) goto LAB_004daee4;
                *puVar8 = 0;
              }
              bVar4 = IR::Opnd::IsEqual((Opnd *)this_00[1]._vptr_Opnd,&baseOpnd->super_Opnd);
              if (bVar4) {
                pIVar9 = IR::Opnd::AsIndirOpnd(&(*ppRVar12)->super_Opnd);
                ppRVar12 = &pIVar9->m_baseOpnd;
                goto LAB_004dad86;
              }
            }
          }
          ppIVar2 = &pIVar7->m_prev;
          pIVar11 = pIVar7;
          pIVar7 = *ppIVar2;
        } while (*ppIVar2 != (Instr *)0x0);
      }
      pRVar10 = (RegOpnd *)0x0;
    }
LAB_004dad8a:
    if (pRVar10 == (RegOpnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1728,"(defOpnd)","defOpnd");
      if (!bVar4) goto LAB_004daee4;
      *puVar8 = 0;
    }
    valueType = (pRVar10->super_Opnd).m_valueType;
    IR::Opnd::SetValueType(&baseOpnd->super_Opnd,(ValueType)valueType);
    opcode = StElemC;
    break;
  case 0xa2:
    local_38 = offset;
    baseOpnd = BuildSrcOpnd(this,baseRegSlot,TyVar);
LAB_004dabce:
    opcode = StArrSegElemC;
  }
  pIVar9 = IR::IndirOpnd::New(baseOpnd,local_3c,TyVar,this->m_func,false);
  pRVar10 = BuildSrcOpnd(this,local_40,TyVar);
  if (local_31 == '\0') {
    if (opcode == StElemC) {
      local_42 = (baseOpnd->super_Opnd).m_valueType.field_0;
      bVar4 = ValueType::IsUninitialized((ValueType *)&local_42.field_0);
      if (!bVar4) {
        instr = (JitProfilingInstr *)
                IR::ProfiledInstr::New
                          (StElemC,&pIVar9->super_Opnd,&pRVar10->super_Opnd,this->m_func);
        this_01 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  new<Memory::JitArenaAllocator>(4,this->m_func->m_alloc,0x3f1274);
        ValueType::ValueType((ValueType *)this_01);
        this_01[1].bits = Float;
        *this_01 = (baseOpnd->super_Opnd).m_valueType.field_0;
        *(anon_union_2_4_ea848c7b_for_ValueType_13 **)&instr->profileId = this_01;
        goto LAB_004dae73;
      }
    }
    instr = (JitProfilingInstr *)
            IR::Instr::New(opcode,&pIVar9->super_Opnd,&pRVar10->super_Opnd,this->m_func);
  }
  else {
    instr = IR::JitProfilingInstr::New(opcode,&pIVar9->super_Opnd,&pRVar10->super_Opnd,this->m_func)
    ;
  }
LAB_004dae73:
  AddInstr(this,&instr->super_Instr,local_38);
  return;
}

Assistant:

void
IRBuilder::BuildElementUnsigned1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot baseRegSlot, uint32 index, Js::RegSlot regSlot)
{
    // This is an array-style access with a constant (integer) index.
    // Embed the index in the indir opnd as a constant offset.

    IR::Instr *     instr;

    const bool simpleJit = m_func->DoSimpleJitDynamicProfile();

    IR::RegOpnd *   regOpnd;
    IR::IndirOpnd * indirOpnd;
    IR::RegOpnd * baseOpnd;
    Js::OpCode opcode;
    switch (newOpcode)
    {
    case Js::OpCode::StArrItemI_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot);

            // This instruction must not create missing values in the array
            baseOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
            baseOpnd->SetValueTypeFixed();

            // In the case of simplejit, we won't know the exact type of array used until run time. Due to this,
            //    we must use the specialized version of StElemC in Lowering.
            opcode = simpleJit ? Js::OpCode::StElemC : Js::OpCode::StElemI_A;
            break;
        }

    case Js::OpCode::StArrItemC_CI4:
        {
            baseOpnd = IR::RegOpnd::New(TyVar, m_func);
            // Insert LdArrHead as the next instr and clear the offset to avoid duplication.
            IR::RegOpnd *const arrayOpnd = this->BuildSrcOpnd(baseRegSlot);

            // This instruction must not create missing values in the array
            arrayOpnd->SetValueType(
                ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(false).SetArrayTypeId(Js::TypeIds_Array));
            arrayOpnd->SetValueTypeFixed();

            this->AddInstr(IR::Instr::New(Js::OpCode::LdArrHead, baseOpnd, arrayOpnd, m_func), offset);
            offset = Js::Constants::NoByteCodeOffset;
            opcode = Js::OpCode::StArrSegElemC;
            break;
        }
    case Js::OpCode::StArrSegItem_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot, TyVar);

            // This instruction must not create missing values in the array

            opcode = Js::OpCode::StArrSegElemC;
            break;
        }
    case Js::OpCode::StArrInlineItem_CI4:
        {
            baseOpnd = this->BuildSrcOpnd(baseRegSlot);

            IR::Opnd *defOpnd = baseOpnd->m_sym->m_instrDef ? baseOpnd->m_sym->m_instrDef->GetDst() : nullptr;
            if (!defOpnd)
            {
                // The array sym may be multi-def because of oddness in the renumbering of temps -- for instance,
                // if there's a loop increment expression whose result is unused (ExprGen only, probably).
                FOREACH_INSTR_BACKWARD(tmpInstr, m_func->m_exitInstr->m_prev)
                {
                    if (tmpInstr->GetDst())
                    {
                        if (tmpInstr->GetDst()->IsEqual(baseOpnd))
                        {
                            defOpnd = tmpInstr->GetDst();
                            break;
                        }
                        else if (tmpInstr->m_opcode == Js::OpCode::StElemC &&
                                 tmpInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->IsEqual(baseOpnd))
                        {
                            defOpnd = tmpInstr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
                            break;
                        }
                    }
                }
                NEXT_INSTR_BACKWARD;
            }
            AnalysisAssert(defOpnd);

            // This instruction must not create missing values in the array
            baseOpnd->SetValueType(defOpnd->GetValueType());

            opcode = Js::OpCode::StElemC;
            break;
        }
    default:
        AssertMsg(false, "Unknown ElementUnsigned1 opcode");
        return;

    }

    indirOpnd = this->BuildIndirOpnd(baseOpnd, index);
    regOpnd = this->BuildSrcOpnd(regSlot);
    if (simpleJit)
    {
        instr = IR::JitProfilingInstr::New(opcode, indirOpnd, regOpnd, m_func);
    }
    else if(opcode == Js::OpCode::StElemC && !baseOpnd->GetValueType().IsUninitialized())
    {
        // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the
        // ProfiledInstr.
        IR::ProfiledInstr *const profiledInstr = IR::ProfiledInstr::New(opcode, indirOpnd, regOpnd, m_func);
        Js::StElemInfo *const stElemInfo = JitAnew(m_func->m_alloc, Js::StElemInfo);
        stElemInfo->arrayType = baseOpnd->GetValueType();
        profiledInstr->u.stElemInfo = stElemInfo;
        instr = profiledInstr;
    }
    else
    {
        instr = IR::Instr::New(opcode, indirOpnd, regOpnd, m_func);
    }

    this->AddInstr(instr, offset);
}